

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubytearray.h
# Opt level: O0

UByteArray * __thiscall UByteArray::toHex(UByteArray *__return_storage_ptr__,UByteArray *this)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  int32_t iVar5;
  byte *pbVar6;
  char *pcVar7;
  int local_50;
  uint8_t high;
  uint8_t low;
  int32_t i;
  allocator local_39;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hex;
  UByteArray *this_local;
  
  hex.field_2._8_8_ = this;
  iVar5 = size(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,(long)(iVar5 * 2),'\0',&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_50 = 0;
  while( true ) {
    iVar5 = size(this);
    if (iVar5 <= local_50) break;
    pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = *pbVar6;
    pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)this);
    bVar2 = *pbVar6;
    cVar3 = 'W';
    if ((bVar1 & 0xf) < 10) {
      cVar3 = '0';
    }
    cVar4 = 'W';
    if (bVar2 >> 4 < 10) {
      cVar4 = '0';
    }
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    *pcVar7 = (bVar2 >> 4) + cVar4;
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    *pcVar7 = (bVar1 & 0xf) + cVar3;
    local_50 = local_50 + 1;
  }
  UByteArray(__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

UByteArray toHex() {
        std::basic_string<char> hex(size() * 2, '\x00');
        for (int32_t i = 0; i < size(); i++) {
            uint8_t low  = d[i] & 0x0F;
            uint8_t high = (d[i] & 0xF0) >> 4;
            low += (low < 10 ? '0' : 'a' - 10);
            high += (high < 10 ? '0' : 'a' - 10);
            hex[2*i] = high;
            hex[2*i + 1] = low;
        }
        return UByteArray(hex);
    }